

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surf.cc
# Opt level: O0

void __thiscall features::Surf::process(Surf *this)

{
  ostream *poVar1;
  size_t sVar2;
  size_type sVar3;
  WallTimer local_20;
  WallTimer total_timer;
  WallTimer timer;
  Surf *this_local;
  
  std::vector<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>::clear
            (&this->keypoints);
  std::vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>::clear
            (&this->descriptors);
  std::vector<features::Surf::Octave,_std::allocator<features::Surf::Octave>_>::clear
            (&this->octaves);
  util::WallTimer::WallTimer(&total_timer);
  util::WallTimer::WallTimer(&local_20);
  if (((this->options).verbose_output & 1U) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"SURF: Creating 4 octaves (0 to 4)...");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  util::WallTimer::reset(&total_timer);
  create_octaves(this);
  if (((this->options).debug_output & 1U) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"SURF: Creating octaves took ");
    sVar2 = util::WallTimer::get_elapsed(&total_timer);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar2);
    poVar1 = std::operator<<(poVar1," ms.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  if (((this->options).debug_output & 1U) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"SURF: Detecting local extrema...");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  util::WallTimer::reset(&total_timer);
  extrema_detection(this);
  if (((this->options).debug_output & 1U) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"SURF: Extrema detection took ");
    sVar2 = util::WallTimer::get_elapsed(&total_timer);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar2);
    poVar1 = std::operator<<(poVar1," ms.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  if (((this->options).debug_output & 1U) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"SURF: Localizing and filtering keypoints...");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  util::WallTimer::reset(&total_timer);
  keypoint_localization_and_filtering(this);
  std::vector<features::Surf::Octave,_std::allocator<features::Surf::Octave>_>::clear
            (&this->octaves);
  if (((this->options).debug_output & 1U) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"SURF: Localization and filtering took ");
    sVar2 = util::WallTimer::get_elapsed(&total_timer);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar2);
    poVar1 = std::operator<<(poVar1," ms.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  if (((this->options).verbose_output & 1U) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"SURF: Generating keypoint descriptors...");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  util::WallTimer::reset(&total_timer);
  descriptor_assignment(this);
  if (((this->options).debug_output & 1U) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"SURF: Generated ");
    sVar3 = std::vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>::
            size(&this->descriptors);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar3);
    poVar1 = std::operator<<(poVar1," descriptors, took ");
    sVar2 = util::WallTimer::get_elapsed(&total_timer);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar2);
    poVar1 = std::operator<<(poVar1,"ms.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  if (((this->options).verbose_output & 1U) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"SURF: Generated ");
    sVar3 = std::vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>::
            size(&this->descriptors);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar3);
    poVar1 = std::operator<<(poVar1," descriptors from ");
    sVar3 = std::vector<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>::size
                      (&this->keypoints);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar3);
    poVar1 = std::operator<<(poVar1," keypoints,");
    poVar1 = std::operator<<(poVar1," took ");
    sVar2 = util::WallTimer::get_elapsed(&local_20);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar2);
    poVar1 = std::operator<<(poVar1,"ms.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  std::__shared_ptr<core::Image<long>,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->sat).super___shared_ptr<core::Image<long>,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

void
Surf::process (void)
{
    this->keypoints.clear();
    this->descriptors.clear();
    this->octaves.clear();

    util::WallTimer timer, total_timer;

    /* Compute Hessian response maps and find SS maxima (SURF 3.3). */
    if (this->options.verbose_output)
    {
        std::cout << "SURF: Creating 4 octaves (0 to 4)..." << std::endl;
    }
    timer.reset();
    this->create_octaves();
    if (this->options.debug_output)
    {
        std::cout << "SURF: Creating octaves took "
            << timer.get_elapsed() << " ms." << std::endl;
    }

    /* Detect local extrema in the SS of Hessian response maps. */
    if (this->options.debug_output)
    {
        std::cout << "SURF: Detecting local extrema..." << std::endl;
    }
    timer.reset();
    this->extrema_detection();
    if (this->options.debug_output)
    {
        std::cout << "SURF: Extrema detection took "
            << timer.get_elapsed() << " ms." << std::endl;
    }

    /* Sub-pixel keypoint localization and filtering of weak keypoints. */
    if (this->options.debug_output)
    {
        std::cout << "SURF: Localizing and filtering keypoints..." << std::endl;
    }
    timer.reset();
    this->keypoint_localization_and_filtering();
    this->octaves.clear();
    if (this->options.debug_output)
    {
        std::cout << "SURF: Localization and filtering took "
            << timer.get_elapsed() << " ms." << std::endl;
    }

    /* Compute the SURF descriptor for the keypoint location. */
    if (this->options.verbose_output)
    {
        std::cout << "SURF: Generating keypoint descriptors..." << std::endl;
    }
    timer.reset();
    this->descriptor_assignment();
    if (this->options.debug_output)
    {
        std::cout << "SURF: Generated " << this->descriptors.size()
            << " descriptors, took " << timer.get_elapsed() << "ms."
            << std::endl;
    }
    if (this->options.verbose_output)
    {
        std::cout << "SURF: Generated " << this->descriptors.size()
            << " descriptors from " << this->keypoints.size() << " keypoints,"
            << " took " << total_timer.get_elapsed() << "ms." << std::endl;
    }

    /* Cleanup. */
    this->sat.reset();
}